

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  uint uVar1;
  bool bVar2;
  ImFontAtlasCustomRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar7;
  ImVec2 IVar6;
  ImVec2 IVar8;
  float fVar10;
  ImVec2 IVar9;
  ImVec2 IVar11;
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    if (this->CustomRectIds[0] == -1) {
      __assert_fail("CustomRectIds[0] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                    ,0x751,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    pIVar3 = ImVector<ImFontAtlasCustomRect>::operator[](&this->CustomRects,this->CustomRectIds[0]);
    IVar8 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    uVar1._0_2_ = pIVar3->X;
    uVar1._2_2_ = pIVar3->Y;
    fVar5 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x + (float)(uVar1 & 0xffff);
    fVar7 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y + (float)(uVar1 >> 0x10);
    IVar6 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar8;
    IVar8.x = (this->TexUvScale).x * fVar5;
    IVar8.y = (this->TexUvScale).y * fVar7;
    *out_uv_border = IVar8;
    fVar4 = IVar6.x;
    fVar10 = fVar7 + IVar6.y;
    IVar11.x = (this->TexUvScale).x * (fVar5 + fVar4);
    IVar11.y = (this->TexUvScale).y * fVar10;
    out_uv_border[1] = IVar11;
    IVar6.x = (fVar5 + 109.0) * (this->TexUvScale).x;
    IVar6.y = fVar7 * (this->TexUvScale).y;
    *out_uv_fill = IVar6;
    IVar9.x = (fVar5 + 109.0 + fVar4) * (this->TexUvScale).x;
    IVar9.y = fVar10 * (this->TexUvScale).y;
    out_uv_fill[1] = IVar9;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}